

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O2

Light_SampleRes *
embree::PointLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  float fVar13;
  undefined1 auVar11 [12];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar12 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vfloat4 a;
  float fVar28;
  float fVar29;
  vfloat4 a_1;
  float fVar30;
  vfloat4 a0;
  Vec3fa localDir;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_28;
  undefined1 auVar31 [16];
  
  local_38 = (float)super[4].type - (dg->P).field_0.m128[0];
  local_58 = (float)super[5].type - (dg->P).field_0.m128[1];
  fStack_30 = (float)super[6].type - (dg->P).field_0.m128[2];
  fStack_2c = (float)super[7].type - (dg->P).field_0.m128[3];
  fVar9 = local_58 * local_58;
  fStack_60 = fStack_30 * fStack_30;
  fStack_5c = fStack_2c * fStack_2c;
  fVar22 = fVar9 + local_38 * local_38 + fStack_60;
  fStack_64 = fVar9 + fVar9 + fStack_5c;
  fStack_60 = fVar9 + fStack_60 + fStack_60;
  fStack_5c = fVar9 + fStack_5c + fStack_5c;
  auVar7._4_4_ = fStack_64;
  auVar7._0_4_ = fVar22;
  auVar7._8_4_ = fStack_60;
  auVar7._12_4_ = fStack_5c;
  auVar8._4_4_ = fStack_64;
  auVar8._0_4_ = fVar22;
  auVar8._8_4_ = fStack_60;
  auVar8._12_4_ = fStack_5c;
  auVar8 = rsqrtss(auVar7,auVar8);
  fVar9 = auVar8._0_4_;
  fVar6 = fVar9 * fVar9 * fVar22 * -0.5 * fVar9 + fVar9 * 1.5;
  local_38 = fVar6 * local_38;
  local_58 = fVar6 * local_58;
  fStack_30 = fVar6 * fStack_30;
  fStack_2c = fVar6 * fStack_2c;
  (__return_storage_ptr__->dir).field_0.m128[0] = local_38;
  (__return_storage_ptr__->dir).field_0.m128[1] = local_58;
  (__return_storage_ptr__->dir).field_0.m128[2] = fStack_30;
  (__return_storage_ptr__->dir).field_0.m128[3] = fStack_2c;
  local_68 = fVar22 * fVar6;
  __return_storage_ptr__->dist = local_68;
  __return_storage_ptr__->pdf = INFINITY;
  fVar10 = fVar6 * fVar6;
  fVar9 = (float)super[9].type;
  fVar23 = (float)super[10].type;
  fVar25 = (float)super[0xb].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar10 * (float)super[8].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar10 * fVar9;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar10 * fVar23;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar10 * fVar25;
  if ((0.0 < (float)super[0xc].type) && (fVar6 = (float)super[0xc].type * fVar6, 0.005 < fVar6)) {
    if (1.0 <= fVar6) {
      local_28.field_0 =
           *(anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 *)&s->field_0;
      cosineSampleHemisphere((embree *)&local_78,(Vec2f *)&local_28.field_0);
      fVar9 = (dg->Ns).field_0.m128[0];
      fVar23 = (dg->Ns).field_0.m128[2];
      fVar25 = -(dg->Ns).field_0.m128[1];
      fVar6 = -fVar23;
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      if (fVar25 * fVar25 + fVar23 * fVar23 + 0.0 <= fVar9 * fVar9 + fVar6 * fVar6 + 0.0) {
        auVar11 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar23 = (float)((uint)fVar23 & auVar11._4_4_);
      fVar6 = (float)(~auVar11._0_4_ & (uint)fVar6);
      fVar24 = (float)(~auVar11._8_4_ & (uint)fVar9 | (uint)fVar25 & auVar11._8_4_);
      fVar9 = fVar23 * fVar23;
      fVar25 = fVar24 * fVar24;
      fVar10 = fVar9 + fVar6 * fVar6 + fVar25;
      fVar22 = fVar9 + fVar9 + 0.0;
      fVar25 = fVar9 + fVar25 + fVar25;
      fVar9 = fVar9 + 0.0 + 0.0;
      auVar26._4_4_ = fVar22;
      auVar26._0_4_ = fVar10;
      auVar26._8_4_ = fVar25;
      auVar26._12_4_ = fVar9;
      auVar2._4_4_ = fVar22;
      auVar2._0_4_ = fVar10;
      auVar2._8_4_ = fVar25;
      auVar2._12_4_ = fVar9;
      auVar8 = rsqrtss(auVar26,auVar2);
      fVar9 = auVar8._0_4_;
      fVar14 = fVar9 * 1.5 - fVar9 * fVar9 * fVar10 * 0.5 * fVar9;
      fVar6 = fVar14 * fVar6;
      fVar23 = fVar14 * fVar23;
      fVar24 = fVar14 * fVar24;
      fVar14 = fVar14 * 0.0;
      fVar9 = (dg->Ns).field_0.m128[0];
      fVar25 = (dg->Ns).field_0.m128[1];
      fVar10 = (dg->Ns).field_0.m128[2];
      fVar22 = (dg->Ns).field_0.m128[3];
      fVar15 = fVar23 * fVar9 - fVar25 * fVar6;
      fVar16 = fVar24 * fVar25 - fVar10 * fVar23;
      fVar17 = fVar6 * fVar10 - fVar9 * fVar24;
      fVar28 = fVar14 * fVar22 - fVar22 * fVar14;
      fVar13 = fVar16 * fVar16;
      fVar18 = fVar17 * fVar17;
      fVar29 = fVar28 * fVar28;
      fVar30 = fVar18 + fVar13 + fVar15 * fVar15;
      auVar31._0_8_ = CONCAT44(fVar29 + fVar13 + fVar13,fVar30);
      auVar31._8_4_ = fVar18 + fVar13 + fVar18;
      auVar31._12_4_ = fVar29 + fVar13 + fVar29;
      auVar21._8_4_ = auVar31._8_4_;
      auVar21._0_8_ = auVar31._0_8_;
      auVar21._12_4_ = auVar31._12_4_;
      auVar8 = rsqrtss(auVar21,auVar31);
      fVar13 = auVar8._0_4_;
      fVar13 = fVar13 * 1.5 - fVar13 * fVar13 * fVar30 * 0.5 * fVar13;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           local_78 * fVar6 + fStack_70 * fVar9 + fStack_74 * fVar13 * fVar16;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           local_78 * fVar23 + fStack_70 * fVar25 + fStack_74 * fVar13 * fVar17;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           local_78 * fVar24 + fStack_70 * fVar10 + fStack_74 * fVar13 * fVar15;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           local_78 * fVar14 + fStack_70 * fVar22 + fStack_74 * fVar13 * fVar28;
      __return_storage_ptr__->pdf = fStack_70 / 3.1415927;
      fVar9 = (float)super[0xc].type;
      fVar23 = fVar9 * fVar9;
      auVar8 = rcpss(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar10 = (2.0 - fVar23 * auVar8._0_4_) * auVar8._0_4_;
      fVar23 = (float)super[9].type;
      fVar25 = (float)super[10].type;
      fVar6 = (float)super[0xb].type;
      (__return_storage_ptr__->weight).field_0.m128[0] = fVar10 * (float)super[8].type;
      (__return_storage_ptr__->weight).field_0.m128[1] = fVar10 * fVar23;
      (__return_storage_ptr__->weight).field_0.m128[2] = fVar10 * fVar25;
      (__return_storage_ptr__->weight).field_0.m128[3] = fVar10 * fVar6;
      __return_storage_ptr__->dist = fVar9;
    }
    else {
      auVar4._4_4_ = fStack_30;
      auVar4._0_4_ = local_58;
      auVar4._8_4_ = fStack_2c;
      local_48 = auVar4._4_8_;
      fVar9 = 1.0 - fVar6 * fVar6;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_34 = local_58;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      uniformSampleCone((embree *)&local_78,fVar9,s);
      fVar25 = -local_58;
      fVar23 = -(float)local_48;
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      if (fVar25 * fVar25 + (float)local_48 * (float)local_48 + 0.0 <=
          local_38 * local_38 + fVar23 * fVar23 + 0.0) {
        auVar19 = SUB1612((undefined1  [16])0x0,0);
      }
      auVar5._4_4_ = (uint)fVar25 & auVar19._8_4_;
      auVar5._0_4_ = (uint)(float)local_48 & auVar19._4_4_;
      auVar5._8_4_ = 0;
      auVar20._0_4_ = ~auVar19._0_4_ & (uint)fVar23;
      auVar20._4_4_ = 0;
      auVar20._8_4_ = ~auVar19._8_4_ & (uint)local_38;
      auVar20 = auVar20 | auVar5 << 0x20;
      fVar6 = auVar20._0_4_;
      fVar13 = auVar20._4_4_;
      fVar14 = auVar20._8_4_;
      fVar23 = fVar13 * fVar13;
      fVar25 = fVar14 * fVar14;
      fVar10 = fVar23 + fVar6 * fVar6 + fVar25;
      fVar24 = fVar23 + fVar23 + 0.0;
      fVar25 = fVar23 + fVar25 + fVar25;
      fVar23 = fVar23 + 0.0 + 0.0;
      auVar27._4_4_ = fVar24;
      auVar27._0_4_ = fVar10;
      auVar27._8_4_ = fVar25;
      auVar27._12_4_ = fVar23;
      auVar1._4_4_ = fVar24;
      auVar1._0_4_ = fVar10;
      auVar1._8_4_ = fVar25;
      auVar1._12_4_ = fVar23;
      auVar8 = rsqrtss(auVar27,auVar1);
      fVar23 = auVar8._0_4_;
      fVar25 = fVar23 * 1.5 - fVar23 * fVar23 * fVar10 * 0.5 * fVar23;
      fVar6 = fVar25 * fVar6;
      fVar13 = fVar25 * fVar13;
      fVar14 = fVar25 * fVar14;
      fVar25 = fVar25 * 0.0;
      fVar10 = fVar13 * local_38 - fStack_34 * fVar6;
      fVar24 = fVar14 * fStack_34 - fStack_30 * fVar13;
      fVar15 = fVar6 * fStack_30 - local_38 * fVar14;
      fVar17 = fVar25 * fStack_2c - fStack_2c * fVar25;
      fVar23 = fVar24 * fVar24;
      fVar16 = fVar15 * fVar15;
      fVar18 = fVar17 * fVar17;
      fVar28 = fVar16 + fVar23 + fVar10 * fVar10;
      fVar29 = fVar18 + fVar23 + fVar23;
      fVar16 = fVar16 + fVar23 + fVar16;
      fVar18 = fVar18 + fVar23 + fVar18;
      auVar12._4_4_ = fVar29;
      auVar12._0_4_ = fVar28;
      auVar12._8_4_ = fVar16;
      auVar12._12_4_ = fVar18;
      auVar3._4_4_ = fVar29;
      auVar3._0_4_ = fVar28;
      auVar3._8_4_ = fVar16;
      auVar3._12_4_ = fVar18;
      auVar8 = rsqrtss(auVar12,auVar3);
      fVar23 = auVar8._0_4_;
      fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * fVar28 * 0.5 * fVar23;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           local_78 * fVar6 + fStack_70 * local_38 + fStack_74 * fVar23 * fVar24;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           local_78 * fVar13 + fStack_70 * fStack_34 + fStack_74 * fVar23 * fVar15;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           local_78 * fVar14 + fStack_70 * fStack_30 + fStack_74 * fVar23 * fVar10;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           local_78 * fVar25 + fStack_70 * fStack_2c + fStack_74 * fVar23 * fVar17;
      fVar9 = (1.0 - fVar9) * 6.2831855;
      auVar8 = rcpss(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      __return_storage_ptr__->pdf = (2.0 - fVar9 * auVar8._0_4_) * auVar8._0_4_;
      fVar9 = (float)super[0xc].type * (float)super[0xc].type -
              (1.0 - fStack_70 * fStack_70) * fVar22;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      __return_storage_ptr__->dist = local_68 * fStack_70 - fVar9;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes PointLight_sample(const Light* super,
                                                               const DifferentialGeometry& dg,
                                                               const Vec2f& s)
{
  const PointLight* self = (PointLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  const Vec3fa dir = self->position - dg.P;
  const float dist2 = dot(dir, dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = dir * invdist;
  res.dist = dist2 * invdist;

  res.pdf = inf; // per default we always take this res

  // convert from power to radiance by attenuating by distance^2
  res.weight = self->power * sqr(invdist);
  const float sinTheta = self->radius * invdist;

  if ((self->radius > 0.f) & (sinTheta > 0.005f)) {
    // res surface of sphere as seen by hit point -> cone of directions
    // for very small cones treat as point light, because float precision is not good enough
    if (sinTheta < 1.f) {
      const float cosTheta = sqrt(1.f - sinTheta * sinTheta);
      const Vec3fa localDir = uniformSampleCone(cosTheta, s);
      res.dir = frame(res.dir) * localDir;
      res.pdf = uniformSampleConePDF(cosTheta);
      const float c = localDir.z;
      res.dist = c*res.dist - sqrt(sqr(self->radius) - (1.f - c*c) * dist2);
      // TODO scale radiance by actual distance
    } else { // inside sphere
      const Vec3fa localDir = cosineSampleHemisphere(s);
      res.dir = frame(dg.Ns) * localDir;
      res.pdf = cosineSampleHemispherePDF(localDir);
      // TODO:
      res.weight = self->power * rcp(sqr(self->radius));
      res.dist = self->radius;
    }
  }

  return res;
}